

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::FindHelper
          (KeyMapBase<unsigned_int> *this,ViewType_conflict k)

{
  NodeBase **ppNVar1;
  NodeBase *pNVar2;
  uintptr_t v;
  ulong uVar3;
  long lVar4;
  NodeAndBucket NVar5;
  
  AssertLoadFactor(this);
  uVar3 = ((ulong)k ^ (ulong)&absl::lts_20250127::hash_internal::MixingHashState::kSeed) *
          -0x234dd359734ecb13;
  ppNVar1 = (this->super_UntypedMapBase).table_;
  uVar3 = ((uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38) ^ (ulong)ppNVar1) * -0x234dd359734ecb13;
  lVar4 = ((uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38) ^ (ulong)ppNVar1) * -0x234dd359734ecb13;
  NVar5.bucket = ((uint)(byte)((ulong)lVar4 >> 0x38) |
                  ((uint)((ulong)lVar4 >> 0x20) & 0xff0000) >> 8 |
                  (uint)((ulong)lVar4 >> 0x18) & 0xff0000 | (uint)((ulong)lVar4 >> 8) & 0xff000000)
                 & (this->super_UntypedMapBase).num_buckets_ - 1;
  pNVar2 = (NodeBase *)(ppNVar1 + NVar5.bucket);
  do {
    pNVar2 = pNVar2->next;
    if (pNVar2 == (NodeBase *)0x0) break;
  } while (*(ViewType_conflict *)&pNVar2[1].next != k);
  NVar5.node = pNVar2;
  NVar5._12_4_ = 0;
  return NVar5;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }